

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_3000_3999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case3053(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t in_ECX;
  allocator<char> local_891;
  string local_890;
  Decl local_870;
  Decl local_7a8;
  allocator<char> local_6d9;
  string local_6d8;
  Decl local_6b8;
  Decl local_5f0;
  allocator<char> local_521;
  string local_520;
  Decl local_500;
  Decl local_438;
  allocator<char> local_369;
  string local_368;
  Decl local_348;
  Decl local_280;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"enum x { y , z , w } ;",&local_31);
  Expectation::Expectation(&local_1b8);
  Decl::Decl(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"x",&local_369);
  pDVar1 = Decl::Type(&local_348,&local_368,EnumDeclaration);
  pDVar1 = Decl::inNameSpace(pDVar1,Tags);
  pDVar1 = Decl::withScopeKind(pDVar1,File);
  Decl::Decl(&local_280,pDVar1);
  pEVar2 = Expectation::declaration(&local_1b8,&local_280);
  Decl::Decl(&local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"y",&local_521);
  pDVar1 = Decl::Member(&local_500,&local_520,EnumeratorDeclaration);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_438,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_438);
  Decl::Decl(&local_6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"z",&local_6d9);
  pDVar1 = Decl::Member(&local_6b8,&local_6d8,EnumeratorDeclaration);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_5f0,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_5f0);
  Decl::Decl(&local_870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"w",&local_891);
  pDVar1 = Decl::Member(&local_870,&local_890,EnumeratorDeclaration);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_7a8,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_7a8);
  Expectation::Expectation(&local_100,pEVar2);
  bind(this,(int)local_30,(sockaddr *)&local_100,in_ECX);
  Expectation::~Expectation(&local_100);
  Decl::~Decl(&local_7a8);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator(&local_891);
  Decl::~Decl(&local_870);
  Decl::~Decl(&local_5f0);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  Decl::~Decl(&local_6b8);
  Decl::~Decl(&local_438);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  Decl::~Decl(&local_500);
  Decl::~Decl(&local_280);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  Decl::~Decl(&local_348);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case3053()
{
    bind("enum x { y , z , w } ;",
         Expectation()
         .declaration(Decl()
                  .Type("x", SymbolKind::EnumDeclaration)
                  .inNameSpace(NameSpace::Tags)
                  .withScopeKind(ScopeKind::File))
         .declaration(Decl()
                  .Member("y", SymbolKind::EnumeratorDeclaration)
                  .ty_.Basic(BasicTypeKind::Int_S))
         .declaration(Decl()
                  .Member("z", SymbolKind::EnumeratorDeclaration)
                  .ty_.Basic(BasicTypeKind::Int_S))
         .declaration(Decl()
                  .Member("w", SymbolKind::EnumeratorDeclaration)
                  .ty_.Basic(BasicTypeKind::Int_S)));
}